

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerMultiBr(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BranchInstr *pBVar5;
  MultiBranchInstr *multiBrInstr;
  Opnd *this_00;
  RegOpnd *indexOpnd;
  
  pIVar1 = instr->m_prev;
  if ((instr->m_src1 == (Opnd *)0x0) || (instr->m_src2 != (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2809,"(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr)",
                       "Expected 1 src opnd on BrB");
    if (!bVar3) goto LAB_0055a701;
    *puVar4 = 0;
  }
  if (instr->m_kind == InstrKindBranch) {
    pBVar5 = IR::Instr::AsBranchInstr(instr);
    bVar3 = IR::BranchInstr::IsMultiBranch(pBVar5);
    if (bVar3) goto LAB_0055a6c4;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x280a,"(instr->IsBranchInstr() && instr->AsBranchInstr()->IsMultiBranch())",
                     "Bad Instruction Lowering Call to LowerMultiBr()");
  if (!bVar3) {
LAB_0055a701:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar4 = 0;
LAB_0055a6c4:
  pBVar5 = IR::Instr::AsBranchInstr(instr);
  multiBrInstr = IR::BranchInstr::AsMultiBrInstr(pBVar5);
  this_00 = IR::Instr::UnlinkSrc1(instr);
  indexOpnd = IR::Opnd::AsRegOpnd(this_00);
  LowerJumpTableMultiBranch(this,multiBrInstr,indexOpnd);
  return pIVar1;
}

Assistant:

IR::Instr* Lowerer::LowerMultiBr(IR::Instr * instr)
{
    IR::Instr * instrPrev = instr->m_prev;

    AssertMsg(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr, "Expected 1 src opnd on BrB");
    AssertMsg(instr->IsBranchInstr() && instr->AsBranchInstr()->IsMultiBranch(), "Bad Instruction Lowering Call to LowerMultiBr()");

    IR::MultiBranchInstr * multiBrInstr = instr->AsBranchInstr()->AsMultiBrInstr();
    IR::RegOpnd * offset = instr->UnlinkSrc1()->AsRegOpnd();
    LowerJumpTableMultiBranch(multiBrInstr, offset);

    return instrPrev;
}